

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

char * getTypedProperty<char_const*>
                 (cmGeneratorTarget *tgt,string *prop,
                 cmGeneratorExpressionInterpreter *genexInterpreter)

{
  cmValue this;
  string *psVar1;
  bool local_65;
  allocator<char> local_52;
  byte local_51;
  string local_50;
  cmValue local_30;
  cmValue value;
  cmGeneratorExpressionInterpreter *genexInterpreter_local;
  string *prop_local;
  cmGeneratorTarget *tgt_local;
  
  value.Value = (string *)genexInterpreter;
  local_30 = cmGeneratorTarget::GetProperty(tgt,prop);
  this.Value = value.Value;
  if (value.Value == (string *)0x0) {
    tgt_local = (cmGeneratorTarget *)cmValue::GetCStr(&local_30);
  }
  else {
    local_65 = cmValue::operator_cast_to_bool(&local_30);
    local_51 = 0;
    if (local_65) {
      psVar1 = cmValue::operator*[abi_cxx11_(&local_30);
      std::__cxx11::string::string((string *)&local_50,(string *)psVar1);
      local_51 = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_52);
    }
    local_65 = !local_65;
    cmGeneratorExpressionInterpreter::Evaluate
              ((cmGeneratorExpressionInterpreter *)this.Value,&local_50,prop);
    tgt_local = (cmGeneratorTarget *)std::__cxx11::string::c_str();
    if (local_65) {
      std::__cxx11::string::~string((string *)&local_50);
      std::allocator<char>::~allocator(&local_52);
    }
    if ((local_51 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return (char *)tgt_local;
}

Assistant:

const char* getTypedProperty<const char*>(
  cmGeneratorTarget const* tgt, const std::string& prop,
  cmGeneratorExpressionInterpreter* genexInterpreter)
{
  cmValue value = tgt->GetProperty(prop);

  if (genexInterpreter == nullptr) {
    return value.GetCStr();
  }

  return genexInterpreter->Evaluate(value ? *value : "", prop).c_str();
}